

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsSingleTableConstraint(Expr *pExpr,SrcList *pSrcList,int iSrc,int bAllowSubq)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  Walker local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pSrcList->a[iSrc].fg.jointype;
  uVar3 = 0;
  uVar4 = 0;
  if ((bVar1 & 0x40) == 0) {
    uVar2 = pExpr->flags;
    uVar4 = uVar3;
    if ((bVar1 & 8) == 0) {
      if ((uVar2 & 1) != 0) goto LAB_0019288d;
    }
    else if (((uVar2 & 1) == 0) || ((pExpr->w).iJoin != pSrcList->a[iSrc].iCursor))
    goto LAB_0019288d;
    if (((uVar2 & 3) != 0) && (0 < iSrc && (pSrcList->a[0].fg.jointype & 0x40) != 0)) {
      lVar5 = 0;
      do {
        if ((pExpr->w).iJoin == *(int *)((long)&pSrcList->a[0].iCursor + lVar5)) {
          uVar4 = 0;
          if (((&pSrcList->a[0].fg.jointype)[lVar5] & 0x40) != 0) goto LAB_0019288d;
          break;
        }
        lVar5 = lVar5 + 0x48;
      } while ((ulong)(uint)iSrc * 0x48 != lVar5);
    }
    local_40.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.walkerDepth = -0x55555556;
    local_40.eCode = 3;
    local_40.mWFlags = 0xaaaa;
    local_40.pParse = (Parse *)0x0;
    local_40.xExprCallback = exprNodeIsConstant;
    local_40.xSelectCallback = exprSelectWalkTableConstant;
    if (bAllowSubq == 0) {
      local_40.xSelectCallback = sqlite3SelectWalkFail;
    }
    local_40.u._4_4_ = 0xaaaaaaaa;
    local_40.u.n = pSrcList->a[iSrc].iCursor;
    sqlite3WalkExprNN(&local_40,pExpr);
    uVar4 = (uint)local_40.eCode;
  }
LAB_0019288d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsSingleTableConstraint(
  Expr *pExpr,                 /* The constraint */
  const SrcList *pSrcList,     /* Complete FROM clause */
  int iSrc,                    /* Which element of pSrcList to use */
  int bAllowSubq               /* Allow non-correlated subqueries */
){
  const SrcItem *pSrc = &pSrcList->a[iSrc];
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)  /* (6a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (6b) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pExpr->w.iJoin==pSrcList->a[jj].iCursor ){
        if( (pSrcList->a[jj].fg.jointype & JT_LTORJ)!=0 ){
          return 0;  /* restriction (6) */
        }
        break;
      }
    }
  }
  /* Rules (1), (2a), and (2b) handled by the following: */
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor, bAllowSubq);
}